

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_json_to_str(JSContext *ctx,JSONStringifyContext *jsc,JSValue holder,JSValue val,
                  JSValue indent)

{
  short sVar1;
  JSValue v_00;
  JSValue v_01;
  JSValue val_00;
  JSValue val_01;
  JSValue obj;
  JSValue val_02;
  JSValue obj_00;
  JSValue val_03;
  JSValue val_04;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue v_07;
  JSValue v_08;
  JSValue v_09;
  JSValue v_10;
  JSValue v_11;
  JSValue v_12;
  JSValue v_13;
  JSValue v_14;
  JSValue v_15;
  JSValue v_16;
  JSValue v_17;
  JSValue val_05;
  JSValue val_06;
  JSValue this_val;
  JSValue v_18;
  JSValue v_19;
  JSValue v_20;
  JSValue obj_01;
  JSValue obj_02;
  JSValue val_07;
  JSValue v_21;
  JSValue v_22;
  JSValue v_23;
  JSValue v_24;
  JSValue v_25;
  JSValue v_26;
  JSValue op2;
  JSValue obj_03;
  JSValue obj_04;
  JSValue prop_00;
  JSValue op1;
  JSValue str2;
  JSValue this_obj;
  JSValue val_08;
  JSValue val_09;
  JSValue holder_00;
  JSValue holder_01;
  JSValue this_val_00;
  JSValue this_val_01;
  JSValue key;
  JSValue key_00;
  JSValue v_27;
  JSValue v_28;
  JSValue val_10;
  JSValue val_11;
  JSValue holder_02;
  JSValue holder_03;
  bool bVar2;
  int iVar3;
  int iVar5;
  BOOL BVar4;
  ulong idx;
  int64_t in_RDX;
  JSContext *in_RSI;
  JSValueUnion in_RDI;
  long in_R8;
  undefined8 in_R9;
  JSValue JVar6;
  JSValue JVar7;
  JSValue JVar8;
  JSValue in_stack_00000000;
  BOOL has_content;
  int ret;
  int cl;
  int64_t len;
  int64_t i;
  JSObject *p;
  JSValue prop;
  JSValue v;
  JSValue tab;
  JSValue sep1;
  JSValue sep;
  JSValue indent1;
  JSValue v_1;
  undefined4 in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  JSContext *in_stack_fffffffffffffc60;
  JSContext *ctx_00;
  int32_t in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  JSValueUnion in_stack_fffffffffffffc70;
  JSValueUnion ctx_01;
  JSValueUnion in_stack_fffffffffffffc78;
  JSValueUnion JVar9;
  JSValueUnion in_stack_fffffffffffffc80;
  JSContext *in_stack_fffffffffffffc88;
  JSValueUnion JVar10;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  JSValueUnion in_stack_fffffffffffffca8;
  JSContext *in_stack_fffffffffffffcb0;
  JSValueUnion in_stack_fffffffffffffcb8;
  int64_t in_stack_fffffffffffffcc0;
  JSValue in_stack_fffffffffffffcd0;
  JSValueUnion in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  JSValueUnion in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 uVar11;
  int in_stack_fffffffffffffcfc;
  JSValueUnion in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  JSValueUnion in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined8 in_stack_fffffffffffffd28;
  JSContext *in_stack_fffffffffffffd30;
  JSValueUnion in_stack_fffffffffffffd38;
  int64_t in_stack_fffffffffffffd40;
  int64_t local_2b8;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  int64_t in_stack_fffffffffffffd58;
  JSContext *local_268;
  JSValueUnion local_1d0;
  JSContext *local_1c8;
  long local_110;
  long local_108;
  JSValueUnion local_d8;
  int64_t iStack_d0;
  int iVar12;
  undefined4 uVar13;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  JVar10.ptr = &stack0x00000008;
  iVar12 = (int)in_R9;
  uVar13 = (undefined4)((ulong)in_R9 >> 0x20);
  idx = (ulong)(iVar12 + 7U);
  switch(idx) {
  case 0:
    val_03.u._4_4_ = in_stack_fffffffffffffc5c;
    val_03.u.int32 = in_stack_fffffffffffffc58;
    val_03.tag = (int64_t)in_stack_fffffffffffffc60;
    JVar6 = JS_ToQuotedStringFree((JSContext *)0x14a9fe,val_03);
    iVar5 = JS_IsException(JVar6);
    if (iVar5 != 0) goto LAB_0014aafb;
    break;
  default:
    v_11.u._4_4_ = in_stack_fffffffffffffc6c;
    v_11.u.int32 = in_stack_fffffffffffffc68;
    v_11.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
    JS_FreeValue(in_stack_fffffffffffffc60,v_11);
    return 0;
  case 6:
    sVar1 = *(short *)(in_R8 + 6);
    if (sVar1 == 5) {
      val_05.tag = (int64_t)in_stack_fffffffffffffc78.ptr;
      val_05.u.ptr = in_stack_fffffffffffffc70.ptr;
      JVar6 = JS_ToStringFree((JSContext *)
                              CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),val_05);
      iVar5 = JS_IsException(JVar6);
      if (iVar5 == 0) {
        val_00.u._4_4_ = in_stack_fffffffffffffc5c;
        val_00.u.int32 = in_stack_fffffffffffffc58;
        val_00.tag = (int64_t)in_stack_fffffffffffffc60;
        JVar6 = JS_ToQuotedStringFree((JSContext *)0x1498c0,val_00);
        iVar5 = JS_IsException(JVar6);
        if (iVar5 == 0) {
          v_18.tag = (int64_t)in_stack_fffffffffffffc88;
          v_18.u.float64 = in_stack_fffffffffffffc80.float64;
          iVar5 = string_buffer_concat_value_free
                            ((StringBuffer *)in_stack_fffffffffffffc78.ptr,v_18);
          return iVar5;
        }
      }
    }
    else if (sVar1 == 4) {
      val_01.u._4_4_ = in_stack_fffffffffffffc5c;
      val_01.u.int32 = in_stack_fffffffffffffc58;
      val_01.tag = (int64_t)in_stack_fffffffffffffc60;
      JVar6 = JS_ToNumberFree((JSContext *)0x149967,val_01);
      iVar5 = JS_IsException(JVar6);
      if (iVar5 == 0) {
        v_19.tag = (int64_t)in_stack_fffffffffffffc88;
        v_19.u.ptr = in_stack_fffffffffffffc80.ptr;
        iVar5 = string_buffer_concat_value_free((StringBuffer *)in_stack_fffffffffffffc78.ptr,v_19);
        return iVar5;
      }
    }
    else {
      if (sVar1 == 6) {
        JVar7.tag._0_4_ = iVar12 + 7U;
        JVar7.u.ptr = JVar10.ptr;
        JVar7.tag._4_4_ = 0;
        iVar5 = string_buffer_concat_value((StringBuffer *)in_stack_fffffffffffffc88,JVar7);
        JVar6.u._4_4_ = in_stack_fffffffffffffc6c;
        JVar6.u.int32 = in_stack_fffffffffffffc68;
        JVar6.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
        JS_FreeValue(in_stack_fffffffffffffc60,JVar6);
        return iVar5;
      }
      JVar8.u._4_4_ = in_stack_fffffffffffffd1c;
      JVar8.u.int32 = in_stack_fffffffffffffd18;
      JVar8.tag._0_4_ = in_stack_fffffffffffffd20;
      JVar8.tag._4_4_ = in_stack_fffffffffffffd24;
      JVar6 = js_array_includes((JSContext *)in_stack_fffffffffffffd10.ptr,JVar8,
                                in_stack_fffffffffffffd0c,(JSValue *)in_stack_fffffffffffffd00.ptr);
      iVar3 = JS_IsException(JVar6);
      if (iVar3 == 0) {
        val_07.tag = idx;
        val_07.u.ptr = JVar10.ptr;
        iVar3 = JS_ToBoolFree(in_stack_fffffffffffffc88,val_07);
        if (iVar3 == 0) {
          JVar9 = in_RDI;
          JS_DupValue((JSContext *)in_RDI.ptr,*JVar10.ptr);
          JS_DupValue((JSContext *)JVar9.ptr,*(JSValue *)&in_RSI->binary_object_count);
          op1.tag = in_stack_fffffffffffffcc0;
          op1.u.ptr = in_stack_fffffffffffffcb8.ptr;
          op2.tag = (int64_t)in_stack_fffffffffffffcb0;
          op2.u.ptr = in_stack_fffffffffffffca8.ptr;
          JVar6 = JS_ConcatString((JSContext *)
                                  CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),op1,
                                  op2);
          local_1d0 = JVar6.u;
          local_1c8 = (JSContext *)JVar6.tag;
          iVar3 = JS_IsException(JVar6);
          if (iVar3 == 0) {
            BVar4 = JS_IsEmptyString(*(JSValue *)&in_RSI->binary_object_count);
            if (BVar4 == 0) {
              v_28.tag = (int64_t)local_1c8;
              v_28.u.float64 = local_1d0.float64;
              ctx_01 = JVar9;
              JS_DupValue((JSContext *)JVar9.ptr,v_28);
              str2.tag = in_stack_fffffffffffffcc0;
              str2.u.float64 = in_stack_fffffffffffffcb8.float64;
              JVar7 = JS_ConcatString3(in_stack_fffffffffffffcb0,
                                       (char *)in_stack_fffffffffffffca8.ptr,str2,
                                       (char *)CONCAT44(in_stack_fffffffffffffca4,
                                                        in_stack_fffffffffffffca0));
              iVar3 = JS_IsException(JVar7);
              if (iVar3 != 0) goto LAB_0014aafb;
              JVar7 = JS_NewString((JSContext *)in_stack_fffffffffffffc70.ptr,
                                   (char *)CONCAT44(in_stack_fffffffffffffc6c,
                                                    in_stack_fffffffffffffc68));
              iVar3 = JS_IsException(JVar7);
              if (iVar3 != 0) goto LAB_0014aafb;
            }
            else {
              v_00.u = (JSValueUnion)in_RSI->class_proto;
              v_00.tag = *(int64_t *)&(in_RSI->function_proto).u;
              JS_DupValue((JSContext *)JVar9.ptr,v_00);
              v_01.u = (JSValueUnion)in_RSI->class_proto;
              v_01.tag = *(int64_t *)&(in_RSI->function_proto).u;
              ctx_01 = JVar9;
              JS_DupValue((JSContext *)JVar9.ptr,v_01);
              JVar9 = in_stack_fffffffffffffc80;
            }
            this_val_01.tag = in_stack_fffffffffffffd40;
            this_val_01.u.float64 = in_stack_fffffffffffffd38.float64;
            js_array_push(in_stack_fffffffffffffd30,this_val_01,iVar5,
                          (JSValue *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                          in_stack_fffffffffffffd1c);
            obj.u._4_4_ = in_stack_fffffffffffffc5c;
            obj.u.int32 = in_stack_fffffffffffffc58;
            obj.tag = (int64_t)in_stack_fffffffffffffc60;
            iVar5 = check_exception_free((JSContext *)0x149e36,obj);
            if ((iVar5 == 0) &&
               (val_04.tag._0_4_ = in_stack_fffffffffffffc68,
               val_04.u = (int32_t)in_stack_fffffffffffffc60,
               val_04.tag._4_4_ = in_stack_fffffffffffffc6c,
               iVar5 = JS_IsArray((JSContext *)
                                  CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                                  val_04), -1 < iVar5)) {
              if (iVar5 == 0) {
                iVar5 = JS_IsUndefined((JSValue)in_RSI->link);
                if (iVar5 == 0) {
                  JVar7 = JS_DupValue((JSContext *)ctx_01.ptr,(JSValue)in_RSI->link);
                  local_d8 = JVar7.u;
                  local_2b8 = JVar7.tag;
                  iStack_d0 = local_2b8;
                }
                else {
                  this_val.tag = (int64_t)JVar9.ptr;
                  this_val.u.ptr = in_stack_fffffffffffffc78.ptr;
                  JVar7 = js_object_keys((JSContext *)in_stack_fffffffffffffc70.ptr,this_val,
                                         in_stack_fffffffffffffc6c,
                                         (JSValue *)in_stack_fffffffffffffc60,
                                         in_stack_fffffffffffffc5c);
                  local_d8 = JVar7.u;
                  iStack_d0 = JVar7.tag;
                }
                v_27.tag = iStack_d0;
                v_27.u.float64 = local_d8.float64;
                iVar5 = JS_IsException(v_27);
                if ((iVar5 != 0) ||
                   (obj_02.tag = (int64_t)JVar10.ptr, obj_02.u.ptr = in_RDI.ptr,
                   iVar5 = js_get_length64((JSContext *)JVar9.ptr,
                                           (int64_t *)in_stack_fffffffffffffc78.ptr,obj_02),
                   iVar5 != 0)) goto LAB_0014aafb;
                string_buffer_putc8((StringBuffer *)
                                    CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),0)
                ;
                bVar2 = false;
                for (local_108 = 0; local_108 < local_110; local_108 = local_108 + 1) {
                  v_03.u._4_4_ = in_stack_fffffffffffffc6c;
                  v_03.u.int32 = in_stack_fffffffffffffc68;
                  v_03.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
                  JS_FreeValue(in_stack_fffffffffffffc60,v_03);
                  obj_04.tag = (int64_t)in_stack_fffffffffffffcb0;
                  obj_04.u.ptr = in_stack_fffffffffffffca8.ptr;
                  JVar7 = JS_GetPropertyInt64((JSContext *)
                                              CONCAT44(in_stack_fffffffffffffca4,
                                                       in_stack_fffffffffffffca0),obj_04,idx);
                  in_stack_fffffffffffffd10 = JVar7.u;
                  ctx_00 = (JSContext *)JVar7.tag;
                  iVar5 = JS_IsException(JVar7);
                  if (iVar5 != 0) goto LAB_0014aafb;
                  JVar9 = ctx_01;
                  JVar8 = JS_DupValue((JSContext *)ctx_01.ptr,JVar7);
                  in_stack_fffffffffffffcf0 = JVar8.u;
                  uVar11 = (undefined4)JVar8.tag;
                  in_stack_fffffffffffffcfc = JVar8.tag._4_4_;
                  this_obj.tag = in_stack_fffffffffffffcc0;
                  this_obj.u.float64 = in_stack_fffffffffffffcb8.float64;
                  prop_00.tag = (int64_t)in_stack_fffffffffffffcb0;
                  prop_00.u.ptr = in_stack_fffffffffffffca8.ptr;
                  JVar8 = JS_GetPropertyValue((JSContext *)
                                              CONCAT44(in_stack_fffffffffffffca4,
                                                       in_stack_fffffffffffffca0),this_obj,prop_00);
                  in_stack_fffffffffffffd00 = JVar8.u;
                  in_stack_fffffffffffffd08 = (undefined4)JVar8.tag;
                  in_stack_fffffffffffffd0c = JVar8.tag._4_4_;
                  iVar5 = JS_IsException(JVar8);
                  in_stack_fffffffffffffc70 = ctx_01;
                  if (iVar5 != 0) goto LAB_0014aafb;
                  in_stack_fffffffffffffc58 = JVar7.u._0_4_;
                  in_stack_fffffffffffffc5c = JVar7.u._4_4_;
                  holder_01.u._4_4_ = in_stack_fffffffffffffcfc;
                  holder_01.u.int32 = uVar11;
                  holder_01.tag = (int64_t)in_stack_fffffffffffffd00.ptr;
                  val_09.u._4_4_ = in_stack_fffffffffffffcec;
                  val_09.u.int32 = in_stack_fffffffffffffce8;
                  val_09.tag = (int64_t)in_stack_fffffffffffffcf0.ptr;
                  key_00.u._4_4_ = in_stack_fffffffffffffd54;
                  key_00.u.int32 = in_stack_fffffffffffffd50;
                  key_00.tag = in_stack_fffffffffffffd58;
                  JVar7 = js_json_check((JSContext *)in_stack_fffffffffffffce0.ptr,
                                        (JSONStringifyContext *)in_stack_fffffffffffffcd0.tag,
                                        holder_01,val_09,key_00);
                  in_stack_fffffffffffffce0 = JVar7.u;
                  in_stack_fffffffffffffce8 = (undefined4)JVar7.tag;
                  in_stack_fffffffffffffcec = JVar7.tag._4_4_;
                  iVar5 = JS_IsException(JVar7);
                  in_stack_fffffffffffffc60 = ctx_00;
                  in_stack_fffffffffffffc70 = ctx_01;
                  if (iVar5 != 0) goto LAB_0014aafb;
                  iVar5 = JS_IsUndefined(JVar7);
                  in_stack_fffffffffffffc60 = ctx_00;
                  in_stack_fffffffffffffc70 = ctx_01;
                  if (iVar5 == 0) {
                    in_stack_fffffffffffffc60 = local_1c8;
                    if (bVar2) {
                      string_buffer_putc8((StringBuffer *)
                                          CONCAT44(in_stack_fffffffffffffc5c,
                                                   in_stack_fffffffffffffc58),0);
                      in_stack_fffffffffffffc70 = ctx_01;
                      in_stack_fffffffffffffc60 = local_1c8;
                    }
                    val_02.u._4_4_ = in_stack_fffffffffffffc5c;
                    val_02.u.int32 = in_stack_fffffffffffffc58;
                    val_02.tag = (int64_t)ctx_00;
                    in_stack_fffffffffffffcd0 = JS_ToQuotedStringFree((JSContext *)0x14a6fc,val_02);
                    iVar5 = JS_IsException(in_stack_fffffffffffffcd0);
                    if (iVar5 != 0) {
                      v_04.u._4_4_ = in_stack_fffffffffffffc6c;
                      v_04.u.int32 = in_stack_fffffffffffffc68;
                      v_04.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
                      JS_FreeValue(ctx_00,v_04);
                      in_stack_fffffffffffffc60 = ctx_00;
                      goto LAB_0014aafb;
                    }
                    v_23.tag = idx;
                    v_23.u.ptr = JVar10.ptr;
                    string_buffer_concat_value((StringBuffer *)in_RDI.ptr,v_23);
                    v_24.tag = idx;
                    v_24.u.ptr = JVar10.ptr;
                    string_buffer_concat_value((StringBuffer *)in_RDI.ptr,v_24);
                    string_buffer_putc8((StringBuffer *)
                                        CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58
                                                ),0);
                    v_25.tag = idx;
                    v_25.u.ptr = JVar10.ptr;
                    string_buffer_concat_value((StringBuffer *)in_RDI.ptr,v_25);
                    holder_03.u._4_4_ = uVar13;
                    holder_03.u.int32 = iVar12;
                    holder_03.tag = in_RDX;
                    val_11.tag = in_R8;
                    val_11.u.float64 = JVar9.float64;
                    in_stack_fffffffffffffc58 = JVar6.u._0_4_;
                    in_stack_fffffffffffffc5c = JVar6.u._4_4_;
                    local_1c8 = in_stack_fffffffffffffc60;
                    iVar5 = js_json_to_str(in_RSI,(JSONStringifyContext *)in_stack_fffffffffffffc60,
                                           holder_03,val_11,in_stack_00000000);
                    if (iVar5 != 0) goto LAB_0014aafb;
                    bVar2 = true;
                  }
                  ctx_01 = JVar9;
                }
                if ((bVar2) &&
                   ((*(ulong *)(*(long *)&in_RSI->binary_object_count + 4) & 0x7fffffff) != 0)) {
                  string_buffer_putc8((StringBuffer *)
                                      CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                                      0);
                  v_26.tag = idx;
                  v_26.u.float64 = JVar10.float64;
                  string_buffer_concat_value((StringBuffer *)in_RDI.ptr,v_26);
                }
                string_buffer_putc8((StringBuffer *)
                                    CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),0)
                ;
              }
              else {
                obj_01.tag = (int64_t)JVar10.ptr;
                obj_01.u.ptr = in_RDI.ptr;
                iVar5 = js_get_length64((JSContext *)JVar9.ptr,
                                        (int64_t *)in_stack_fffffffffffffc78.ptr,obj_01);
                if (iVar5 != 0) goto LAB_0014aafb;
                string_buffer_putc8((StringBuffer *)
                                    CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),0)
                ;
                for (local_108 = 0; local_108 < local_110; local_108 = local_108 + 1) {
                  JVar9 = ctx_01;
                  if (0 < local_108) {
                    string_buffer_putc8((StringBuffer *)
                                        CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58
                                                ),0);
                    JVar9 = ctx_01;
                  }
                  v_21.tag = idx;
                  v_21.u.ptr = JVar10.ptr;
                  string_buffer_concat_value((StringBuffer *)in_RDI.ptr,v_21);
                  obj_03.tag = (int64_t)in_stack_fffffffffffffcb0;
                  obj_03.u.float64 = in_stack_fffffffffffffca8.float64;
                  JVar7 = JS_GetPropertyInt64((JSContext *)
                                              CONCAT44(in_stack_fffffffffffffca4,
                                                       in_stack_fffffffffffffca0),obj_03,idx);
                  iVar5 = JS_IsException(JVar7);
                  if (iVar5 != 0) goto LAB_0014aafb;
                  ctx_01 = JVar9;
                  if (local_108 != (int)local_108) {
                    __JS_NewFloat64((JSContext *)JVar9.ptr,(double)local_108);
                  }
                  val_06.tag = (int64_t)JVar9.ptr;
                  val_06.u.ptr = in_stack_fffffffffffffc70.ptr;
                  JVar7 = JS_ToStringFree((JSContext *)
                                          CONCAT44(in_stack_fffffffffffffc6c,
                                                   in_stack_fffffffffffffc68),val_06);
                  local_268 = (JSContext *)JVar7.tag;
                  iVar5 = JS_IsException(JVar7);
                  if (iVar5 != 0) goto LAB_0014aafb;
                  holder_00.u._4_4_ = in_stack_fffffffffffffcfc;
                  holder_00.u.int32 = in_stack_fffffffffffffcf8;
                  holder_00.tag = (int64_t)in_stack_fffffffffffffd00.ptr;
                  val_08.u._4_4_ = in_stack_fffffffffffffcec;
                  val_08.u.int32 = in_stack_fffffffffffffce8;
                  val_08.tag = (int64_t)in_stack_fffffffffffffcf0.ptr;
                  key.u._4_4_ = in_stack_fffffffffffffd54;
                  key.u.int32 = in_stack_fffffffffffffd50;
                  key.tag = in_stack_fffffffffffffd58;
                  JVar7 = js_json_check((JSContext *)in_stack_fffffffffffffce0.ptr,
                                        (JSONStringifyContext *)in_stack_fffffffffffffcd0.tag,
                                        holder_00,val_08,key);
                  v_02.u._4_4_ = in_stack_fffffffffffffc6c;
                  v_02.u.int32 = in_stack_fffffffffffffc68;
                  v_02.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
                  JS_FreeValue(local_268,v_02);
                  iVar5 = JS_IsException(JVar7);
                  in_stack_fffffffffffffc60 = local_268;
                  if (iVar5 != 0) goto LAB_0014aafb;
                  in_stack_fffffffffffffc60 = local_1c8;
                  iVar5 = JS_IsUndefined(JVar7);
                  if (iVar5 != 0) {
                    in_stack_fffffffffffffd50 = 0;
                    in_stack_fffffffffffffd58 = 2;
                  }
                  holder_02.u._4_4_ = uVar13;
                  holder_02.u.int32 = iVar12;
                  holder_02.tag = in_RDX;
                  val_10.tag = in_R8;
                  val_10.u.float64 = ctx_01.float64;
                  in_stack_fffffffffffffc58 = JVar6.u._0_4_;
                  in_stack_fffffffffffffc5c = JVar6.u._4_4_;
                  local_1c8 = in_stack_fffffffffffffc60;
                  iVar5 = js_json_to_str(in_RSI,(JSONStringifyContext *)in_stack_fffffffffffffc60,
                                         holder_02,val_10,in_stack_00000000);
                  if (iVar5 != 0) goto LAB_0014aafb;
                }
                if ((0 < local_110) &&
                   (BVar4 = JS_IsEmptyString(*(JSValue *)&in_RSI->binary_object_count), BVar4 == 0))
                {
                  string_buffer_putc8((StringBuffer *)
                                      CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                                      0);
                  v_22.tag = idx;
                  v_22.u.ptr = JVar10.ptr;
                  string_buffer_concat_value((StringBuffer *)in_RDI.ptr,v_22);
                }
                string_buffer_putc8((StringBuffer *)
                                    CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),0)
                ;
              }
              in_stack_fffffffffffffc68 = ctx_01.int32;
              in_stack_fffffffffffffc6c = ctx_01._4_4_;
              this_val_00.u._4_4_ = in_stack_fffffffffffffd0c;
              this_val_00.u.int32 = in_stack_fffffffffffffd08;
              this_val_00.tag = (int64_t)in_stack_fffffffffffffd10.ptr;
              js_array_pop((JSContext *)in_stack_fffffffffffffd00.ptr,this_val_00,
                           in_stack_fffffffffffffcfc,(JSValue *)in_stack_fffffffffffffcf0.ptr,
                           in_stack_fffffffffffffcec);
              obj_00.u._4_4_ = in_stack_fffffffffffffc5c;
              obj_00.u.int32 = in_stack_fffffffffffffc58;
              obj_00.tag = (int64_t)in_stack_fffffffffffffc60;
              iVar5 = check_exception_free((JSContext *)0x14a919,obj_00);
              if (iVar5 == 0) {
                v_05.u._4_4_ = in_stack_fffffffffffffc6c;
                v_05.u.int32 = in_stack_fffffffffffffc68;
                v_05.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
                JS_FreeValue(in_stack_fffffffffffffc60,v_05);
                v_06.u._4_4_ = in_stack_fffffffffffffc6c;
                v_06.u.int32 = in_stack_fffffffffffffc68;
                v_06.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
                JS_FreeValue(in_stack_fffffffffffffc60,v_06);
                v_07.u._4_4_ = in_stack_fffffffffffffc6c;
                v_07.u.int32 = in_stack_fffffffffffffc68;
                v_07.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
                JS_FreeValue(in_stack_fffffffffffffc60,v_07);
                v_08.u._4_4_ = in_stack_fffffffffffffc6c;
                v_08.u.int32 = in_stack_fffffffffffffc68;
                v_08.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
                JS_FreeValue(in_stack_fffffffffffffc60,v_08);
                v_09.u._4_4_ = in_stack_fffffffffffffc6c;
                v_09.u.int32 = in_stack_fffffffffffffc68;
                v_09.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
                JS_FreeValue(in_stack_fffffffffffffc60,v_09);
                v_10.u._4_4_ = in_stack_fffffffffffffc6c;
                v_10.u.int32 = in_stack_fffffffffffffc68;
                v_10.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
                JS_FreeValue(in_stack_fffffffffffffc60,v_10);
                return 0;
              }
            }
          }
        }
        else {
          JS_ThrowTypeError((JSContext *)in_RDI.ptr,"circular reference");
        }
      }
    }
LAB_0014aafb:
    v_12.u._4_4_ = in_stack_fffffffffffffc6c;
    v_12.u.int32 = in_stack_fffffffffffffc68;
    v_12.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
    JS_FreeValue(in_stack_fffffffffffffc60,v_12);
    v_13.u._4_4_ = in_stack_fffffffffffffc6c;
    v_13.u.int32 = in_stack_fffffffffffffc68;
    v_13.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
    JS_FreeValue(in_stack_fffffffffffffc60,v_13);
    v_14.u._4_4_ = in_stack_fffffffffffffc6c;
    v_14.u.int32 = in_stack_fffffffffffffc68;
    v_14.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
    JS_FreeValue(in_stack_fffffffffffffc60,v_14);
    v_15.u._4_4_ = in_stack_fffffffffffffc6c;
    v_15.u.int32 = in_stack_fffffffffffffc68;
    v_15.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
    JS_FreeValue(in_stack_fffffffffffffc60,v_15);
    v_16.u._4_4_ = in_stack_fffffffffffffc6c;
    v_16.u.int32 = in_stack_fffffffffffffc68;
    v_16.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
    JS_FreeValue(in_stack_fffffffffffffc60,v_16);
    v_17.u._4_4_ = in_stack_fffffffffffffc6c;
    v_17.u.int32 = in_stack_fffffffffffffc68;
    v_17.tag = (int64_t)in_stack_fffffffffffffc70.ptr;
    JS_FreeValue(in_stack_fffffffffffffc60,v_17);
    return -1;
  case 7:
  case 8:
  case 9:
    break;
  case 0xe:
  }
  v_20.tag = (int64_t)in_stack_fffffffffffffc88;
  v_20.u.ptr = in_stack_fffffffffffffc80.ptr;
  iVar5 = string_buffer_concat_value_free((StringBuffer *)in_stack_fffffffffffffc78.ptr,v_20);
  return iVar5;
}

Assistant:

static int js_json_to_str(JSContext *ctx, JSONStringifyContext *jsc,
                          JSValueConst holder, JSValue val,
                          JSValueConst indent)
{
    JSValue indent1, sep, sep1, tab, v, prop;
    JSObject *p;
    int64_t i, len;
    int cl, ret;
    BOOL has_content;
    
    indent1 = JS_UNDEFINED;
    sep = JS_UNDEFINED;
    sep1 = JS_UNDEFINED;
    tab = JS_UNDEFINED;
    prop = JS_UNDEFINED;

    switch (JS_VALUE_GET_NORM_TAG(val)) {
    case JS_TAG_OBJECT:
        p = JS_VALUE_GET_OBJ(val);
        cl = p->class_id;
        if (cl == JS_CLASS_STRING) {
            val = JS_ToStringFree(ctx, val);
            if (JS_IsException(val))
                goto exception;
            val = JS_ToQuotedStringFree(ctx, val);
            if (JS_IsException(val))
                goto exception;
            return string_buffer_concat_value_free(jsc->b, val);
        } else if (cl == JS_CLASS_NUMBER) {
            val = JS_ToNumberFree(ctx, val);
            if (JS_IsException(val))
                goto exception;
            return string_buffer_concat_value_free(jsc->b, val);
        } else if (cl == JS_CLASS_BOOLEAN) {
            ret = string_buffer_concat_value(jsc->b, p->u.object_data);
            JS_FreeValue(ctx, val);
            return ret;
        }
#ifdef CONFIG_BIGNUM
        else if (cl == JS_CLASS_BIG_FLOAT) {
            return string_buffer_concat_value_free(jsc->b, val);
        } else if (cl == JS_CLASS_BIG_INT) {
            JS_ThrowTypeError(ctx, "bigint are forbidden in JSON.stringify");
            goto exception;
        }
#endif
        v = js_array_includes(ctx, jsc->stack, 1, (JSValueConst *)&val);
        if (JS_IsException(v))
            goto exception;
        if (JS_ToBoolFree(ctx, v)) {
            JS_ThrowTypeError(ctx, "circular reference");
            goto exception;
        }
        indent1 = JS_ConcatString(ctx, JS_DupValue(ctx, indent), JS_DupValue(ctx, jsc->gap));
        if (JS_IsException(indent1))
            goto exception;
        if (!JS_IsEmptyString(jsc->gap)) {
            sep = JS_ConcatString3(ctx, "\n", JS_DupValue(ctx, indent1), "");
            if (JS_IsException(sep))
                goto exception;
            sep1 = JS_NewString(ctx, " ");
            if (JS_IsException(sep1))
                goto exception;
        } else {
            sep = JS_DupValue(ctx, jsc->empty);
            sep1 = JS_DupValue(ctx, jsc->empty);
        }
        v = js_array_push(ctx, jsc->stack, 1, (JSValueConst *)&val, 0);
        if (check_exception_free(ctx, v))
            goto exception;
        ret = JS_IsArray(ctx, val);
        if (ret < 0)
            goto exception;
        if (ret) {
            if (js_get_length64(ctx, &len, val))
                goto exception;
            string_buffer_putc8(jsc->b, '[');
            for(i = 0; i < len; i++) {
                if (i > 0)
                    string_buffer_putc8(jsc->b, ',');
                string_buffer_concat_value(jsc->b, sep);
                v = JS_GetPropertyInt64(ctx, val, i);
                if (JS_IsException(v))
                    goto exception;
                /* XXX: could do this string conversion only when needed */
                prop = JS_ToStringFree(ctx, JS_NewInt64(ctx, i));
                if (JS_IsException(prop))
                    goto exception;
                v = js_json_check(ctx, jsc, val, v, prop);
                JS_FreeValue(ctx, prop);
                prop = JS_UNDEFINED;
                if (JS_IsException(v))
                    goto exception;
                if (JS_IsUndefined(v))
                    v = JS_NULL;
                if (js_json_to_str(ctx, jsc, val, v, indent1))
                    goto exception;
            }
            if (len > 0 && !JS_IsEmptyString(jsc->gap)) {
                string_buffer_putc8(jsc->b, '\n');
                string_buffer_concat_value(jsc->b, indent);
            }
            string_buffer_putc8(jsc->b, ']');
        } else {
            if (!JS_IsUndefined(jsc->property_list))
                tab = JS_DupValue(ctx, jsc->property_list);
            else
                tab = js_object_keys(ctx, JS_UNDEFINED, 1, (JSValueConst *)&val, JS_ITERATOR_KIND_KEY);
            if (JS_IsException(tab))
                goto exception;
            if (js_get_length64(ctx, &len, tab))
                goto exception;
            string_buffer_putc8(jsc->b, '{');
            has_content = FALSE;
            for(i = 0; i < len; i++) {
                JS_FreeValue(ctx, prop);
                prop = JS_GetPropertyInt64(ctx, tab, i);
                if (JS_IsException(prop))
                    goto exception;
                v = JS_GetPropertyValue(ctx, val, JS_DupValue(ctx, prop));
                if (JS_IsException(v))
                    goto exception;
                v = js_json_check(ctx, jsc, val, v, prop);
                if (JS_IsException(v))
                    goto exception;
                if (!JS_IsUndefined(v)) {
                    if (has_content)
                        string_buffer_putc8(jsc->b, ',');
                    prop = JS_ToQuotedStringFree(ctx, prop);
                    if (JS_IsException(prop)) {
                        JS_FreeValue(ctx, v);
                        goto exception;
                    }
                    string_buffer_concat_value(jsc->b, sep);
                    string_buffer_concat_value(jsc->b, prop);
                    string_buffer_putc8(jsc->b, ':');
                    string_buffer_concat_value(jsc->b, sep1);
                    if (js_json_to_str(ctx, jsc, val, v, indent1))
                        goto exception;
                    has_content = TRUE;
                }
            }
            if (has_content && JS_VALUE_GET_STRING(jsc->gap)->len != 0) {
                string_buffer_putc8(jsc->b, '\n');
                string_buffer_concat_value(jsc->b, indent);
            }
            string_buffer_putc8(jsc->b, '}');
        }
        if (check_exception_free(ctx, js_array_pop(ctx, jsc->stack, 0, NULL, 0)))
            goto exception;
        JS_FreeValue(ctx, val);
        JS_FreeValue(ctx, tab);
        JS_FreeValue(ctx, sep);
        JS_FreeValue(ctx, sep1);
        JS_FreeValue(ctx, indent1);
        JS_FreeValue(ctx, prop);
        return 0;
    case JS_TAG_STRING:
        val = JS_ToQuotedStringFree(ctx, val);
        if (JS_IsException(val))
            goto exception;
        goto concat_value;
    case JS_TAG_FLOAT64:
        if (!isfinite(JS_VALUE_GET_FLOAT64(val))) {
            val = JS_NULL;
        }
        goto concat_value;
    case JS_TAG_INT:
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
#endif
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
    concat_value:
        return string_buffer_concat_value_free(jsc->b, val);
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        JS_ThrowTypeError(ctx, "bigint are forbidden in JSON.stringify");
        goto exception;
#endif
    default:
        JS_FreeValue(ctx, val);
        return 0;
    }
    
exception:
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, tab);
    JS_FreeValue(ctx, sep);
    JS_FreeValue(ctx, sep1);
    JS_FreeValue(ctx, indent1);
    JS_FreeValue(ctx, prop);
    return -1;
}